

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O0

void __thiscall YAML::Scanner::ScanBlockEntry(Scanner *this)

{
  bool bVar1;
  undefined8 uVar2;
  Stream *in_RDI;
  Mark mark;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 uVar3;
  Mark *in_stack_fffffffffffffe98;
  ParserException *in_stack_fffffffffffffea0;
  INDENT_TYPE in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  Scanner *in_stack_ffffffffffffff08;
  allocator local_99;
  string local_98 [32];
  Mark local_78;
  Mark local_68;
  undefined1 local_5a;
  allocator local_59;
  string local_58 [32];
  Mark local_38;
  Mark local_18;
  
  bVar1 = InFlowContext((Scanner *)0xf20521);
  if (bVar1) {
    local_5a = 1;
    uVar2 = __cxa_allocate_exception(0x40);
    local_38 = YAML::Stream::mark(in_RDI);
    local_18 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"illegal block entry",&local_59);
    ParserException::ParserException
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               (string *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    local_5a = 0;
    __cxa_throw(uVar2,&ParserException::typeinfo,ParserException::~ParserException);
  }
  if ((in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x3a & 1)
      == 0) {
    uVar2 = __cxa_allocate_exception(0x40);
    local_78 = YAML::Stream::mark(in_RDI);
    local_68 = local_78;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"illegal block entry",&local_99);
    ParserException::ParserException
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               (string *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    __cxa_throw(uVar2,&ParserException::typeinfo,ParserException::~ParserException);
  }
  YAML::Stream::column(in_RDI);
  uVar3 = 1;
  PushIndentTo(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
  in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x3a = 1;
  in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x3b = 0;
  YAML::Stream::mark(in_RDI);
  YAML::Stream::eat((Stream *)CONCAT44(uVar3,in_stack_fffffffffffffe90),in_stack_fffffffffffffe8c);
  Token::Token((Token *)&stack0xfffffffffffffef0,(TYPE)((ulong)(in_RDI + 1) >> 0x20),
               (Mark *)CONCAT44(uVar3,in_stack_fffffffffffffe90));
  std::queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_>::push
            ((queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_> *)
             CONCAT44(uVar3,in_stack_fffffffffffffe90),
             (value_type *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  Token::~Token((Token *)CONCAT44(uVar3,in_stack_fffffffffffffe90));
  return;
}

Assistant:

void Scanner::ScanBlockEntry() {
  // we better be in the block context!
  if (InFlowContext())
    throw ParserException(INPUT.mark(), ErrorMsg::BLOCK_ENTRY);

  // can we put it here?
  if (!m_simpleKeyAllowed)
    throw ParserException(INPUT.mark(), ErrorMsg::BLOCK_ENTRY);

  PushIndentTo(INPUT.column(), IndentMarker::SEQ);
  m_simpleKeyAllowed = true;
  m_canBeJSONFlow = false;

  // eat
  Mark mark = INPUT.mark();
  INPUT.eat(1);
  m_tokens.push(Token(Token::BLOCK_ENTRY, mark));
}